

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Alex
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this)

{
  int *piVar1;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this_00;
  undefined1 auVar2 [64];
  
  this->root_node_ = (AlexNode<int,_int> *)0x0;
  this->superroot_ = (model_node_type *)0x0;
  (this->params_).expected_insert_frac = 1.0;
  (this->params_).max_node_size = 0x1000000;
  (this->params_).approximate_model_computation = true;
  (this->params_).approximate_cost_computation = false;
  (this->derived_params_).max_fanout = 0x200000;
  (this->derived_params_).max_data_node_slots = 0x200000;
  (this->stats_).num_model_node_splits = 0;
  (this->stats_).num_keys = 0;
  (this->stats_).num_model_nodes = 0;
  (this->stats_).num_data_nodes = 0;
  (this->stats_).num_expand_and_scales = 0;
  (this->stats_).num_expand_and_retrains = 0;
  (this->stats_).num_downward_splits = 0;
  (this->stats_).num_sideways_splits = 0;
  (this->stats_).num_model_node_expansions = 0;
  auVar2 = ZEXT464(0) << 0x40;
  (this->stats_).num_downward_split_keys = auVar2._0_8_;
  (this->stats_).num_sideways_split_keys = auVar2._8_8_;
  (this->stats_).num_model_node_expansion_pointers = auVar2._16_8_;
  (this->stats_).num_model_node_split_pointers = auVar2._24_8_;
  (this->stats_).num_node_lookups = auVar2._32_8_;
  (this->stats_).num_lookups = auVar2._40_8_;
  (this->stats_).num_inserts = auVar2._48_8_;
  (this->stats_).splitting_time = (double)auVar2._56_8_;
  *(undefined1 (*) [64])((long)&(this->stats_).num_sideways_split_keys + 4) = auVar2;
  (this->experimental_params_).splitting_policy_method = 1;
  (this->experimental_params_).allow_splitting_upwards = false;
  (this->istats_).key_domain_min_ = 0x7fffffff;
  (this->istats_).key_domain_max_ = -0x80000000;
  (this->istats_).num_keys_above_key_domain = 0;
  (this->istats_).num_keys_below_key_domain = 0;
  (this->istats_).num_keys_at_last_right_domain_resize = 0;
  (this->istats_).num_keys_at_last_left_domain_resize = 0;
  this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *
            )operator_new(200);
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
  AlexDataNode(this_00,(AlexCompare *)&this->field_0xbc,
               (allocator<std::pair<int,_int>_> *)&this->field_0xbd);
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
            (this_00,(V *)0x0,0,(LinearModel<int> *)0x0,false);
  this->root_node_ = (AlexNode<int,_int> *)this_00;
  piVar1 = &(this->stats_).num_data_nodes;
  *piVar1 = *piVar1 + 1;
  create_superroot(this);
  return;
}

Assistant:

Alex() {
    // Set up root as empty data node
    auto empty_data_node = new (data_node_allocator().allocate(1))
        data_node_type(key_less_, allocator_);
    empty_data_node->bulk_load(nullptr, 0);
    root_node_ = empty_data_node;
    stats_.num_data_nodes++;
    create_superroot();
  }